

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O1

void __thiscall
jsoncons::csv::basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_>::read_to
          (basic_csv_cursor<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          basic_json_visitor<char> *visitor,error_code *ec)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ser_context *context;
  
  iVar1 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])();
  if ((~*(byte *)CONCAT44(extraout_var,iVar1) & 0xc) != 0) {
    basic_staj_event<char>::send_json_event
              (&(this->cursor_visitor_).event_,visitor,
               (ser_context *)
               ((this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[-3] +
               (long)&(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor),ec);
    return;
  }
  (this->parser_).cursor_mode_ = false;
  (this->parser_).actual_cursor_mode_ = false;
  (this->parser_).mark_level_ = (this->parser_).level_;
  basic_staj_event<char>::send_json_event
            (&(this->cursor_visitor_).event_,visitor,
             (ser_context *)
             ((this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[-3] +
             (long)&(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor),ec);
  if (ec->_M_value == 0) {
    read_next(this,visitor,ec);
    (this->parser_).actual_cursor_mode_ = true;
    (this->parser_).cursor_mode_ = (this->parser_).mapping_kind_ != m_columns;
    (this->parser_).mark_level_ = 0;
    iVar1 = (*(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[4])(this);
    context = (ser_context *)
              ((this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor[-3] +
              (long)&(this->super_basic_staj_cursor<char>)._vptr_basic_staj_cursor);
    if (*(char *)CONCAT44(extraout_var_00,iVar1) == '\r') {
      basic_json_visitor<char>::end_object
                (&(this->cursor_visitor_).super_basic_json_visitor<char>,context);
      return;
    }
    basic_json_visitor<char>::end_array
              (&(this->cursor_visitor_).super_basic_json_visitor<char>,context);
    return;
  }
  return;
}

Assistant:

void read_to(basic_json_visitor<CharT>& visitor, std::error_code& ec) override
    {
        if (is_begin_container(current().event_type()))
        {
            parser_.cursor_mode(false);
            parser_.mark_level(parser_.level());
            cursor_visitor_.event().send_json_event(visitor, *this, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            read_next(visitor, ec);
            parser_.cursor_mode(true);
            parser_.mark_level(0);
            if (current().event_type() == staj_event_type::begin_object)
            {
                cursor_visitor_.end_object(*this);
            }
            else
            {
                cursor_visitor_.end_array(*this);
            }
        }
        else
        {
            cursor_visitor_.event().send_json_event(visitor, *this, ec);
        }
    }